

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O1

RpcValue __thiscall
miniros::master::Master::registerSubscriber
          (Master *this,string *caller_id,string *topic,string *type,string *caller_api,
          Connection *connection)

{
  size_type *psVar1;
  Error EVar2;
  XmlRpcValue *pXVar3;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  anon_union_8_8_d5adaace_for__value extraout_RDX_00;
  anon_union_8_8_d5adaace_for__value extraout_RDX_01;
  anon_union_8_8_d5adaace_for__value aVar4;
  RpcValue RVar5;
  long in_stack_00000008;
  XmlRpcValue local_128;
  ReturnStruct st;
  RequesterInfo requesterInfo;
  
  RequesterInfo::RequesterInfo(&requesterInfo);
  EVar2 = RequesterInfo::assign(&requesterInfo,topic,*(int *)(in_stack_00000008 + 8));
  if (EVar2.code != Ok) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (registerSubscriber::loc.initialized_ == false) {
      psVar1 = &st.statusMessage._M_string_length;
      st._0_8_ = psVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&st,"miniros.unknown_package","");
      console::initializeLogLocation(&registerSubscriber::loc,(string *)&st,Warn);
      if ((size_type *)st._0_8_ != psVar1) {
        operator_delete((void *)st._0_8_,st.statusMessage._M_string_length + 1);
      }
    }
    if (registerSubscriber::loc.level_ != Warn) {
      console::setLogLocationLevel(&registerSubscriber::loc,Warn);
      console::checkLogLocationEnabled(&registerSubscriber::loc);
    }
    if (registerSubscriber::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,registerSubscriber::loc.logger_,
                     registerSubscriber::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp"
                     ,300,
                     "Master::RpcValue miniros::master::Master::registerSubscriber(const std::string &, const std::string &, const std::string &, const std::string &, Connection *)"
                     ,"Failed to read network address of caller %s",(topic->_M_dataplus)._M_p);
    }
  }
  ::std::__cxx11::string::_M_assign((string *)&requesterInfo.callerApi);
  MasterHandler::registerSubscriber
            (&st,(MasterHandler *)(caller_id + 0x13),&requesterInfo,type,caller_api);
  XmlRpc::XmlRpcValue::Array((XmlRpcValue *)this,3);
  pXVar3 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar3,&st.statusCode);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_128,&st.statusMessage);
  pXVar3 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
  XmlRpc::XmlRpcValue::operator=(pXVar3,&local_128);
  XmlRpc::XmlRpcValue::invalidate(&local_128);
  pXVar3 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
  XmlRpc::XmlRpcValue::operator=(pXVar3,&st.value);
  XmlRpc::XmlRpcValue::invalidate(&st.value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)st.statusMessage._M_dataplus._M_p != &st.statusMessage.field_2) {
    operator_delete(st.statusMessage._M_dataplus._M_p,
                    st.statusMessage.field_2._M_allocated_capacity + 1);
  }
  network::NetAddress::~NetAddress(&requesterInfo.localAddress);
  network::NetAddress::~NetAddress(&requesterInfo.clientAddress);
  aVar4 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)requesterInfo.callerApi._M_dataplus._M_p != &requesterInfo.callerApi.field_2) {
    operator_delete(requesterInfo.callerApi._M_dataplus._M_p,
                    requesterInfo.callerApi.field_2._M_allocated_capacity + 1);
    aVar4 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)requesterInfo.callerId._M_dataplus._M_p != &requesterInfo.callerId.field_2) {
    operator_delete(requesterInfo.callerId._M_dataplus._M_p,
                    requesterInfo.callerId.field_2._M_allocated_capacity + 1);
    aVar4 = extraout_RDX_01;
  }
  RVar5._value.asDouble = aVar4.asDouble;
  RVar5._0_8_ = this;
  return RVar5;
}

Assistant:

Master::RpcValue Master::registerSubscriber(const std::string& caller_id, const std::string& topic,
  const std::string& type, const std::string& caller_api, Connection* connection)
{
  RequesterInfo requesterInfo;
  if (!requesterInfo.assign(caller_id, connection->getfd())) {
    MINIROS_WARN("Failed to read network address of caller %s", caller_id.c_str());
  }
  requesterInfo.callerApi = caller_api;

  ReturnStruct st = m_handler.registerSubscriber(requesterInfo, topic, type);
  RpcValue res = RpcValue::Array(3);
  res[0] = st.statusCode;
  res[1] = st.statusMessage;
  res[2] = st.value;
  return res;
}